

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.hpp
# Opt level: O2

void ranges::detail::
     introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,ranges::less,ranges::identity>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,
               long depth_limit,less *pred,identity *proj)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_00;
  long depth_limit_00;
  
  depth_limit_00 = depth_limit + -1;
  while( true ) {
    if ((long)last._M_current - (long)first._M_current < 0x41) {
      return;
    }
    if (depth_limit_00 == -1) break;
    first_00 = unguarded_partition<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,ranges::less,ranges::identity>
                         (first,last,pred,proj);
    introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,ranges::less,ranges::identity>
              (first_00,last,depth_limit_00,pred,proj);
    depth_limit_00 = depth_limit_00 + -1;
    last = first_00;
  }
  partial_sort_fn::
  operator()<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,___gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_std::reference_wrapper<ranges::less>,_std::reference_wrapper<ranges::identity>_>
            ((partial_sort_fn *)&partial_sort,first,last,last,(reference_wrapper<ranges::less>)pred,
             (reference_wrapper<ranges::identity>)proj);
  return;
}

Assistant:

inline void introsort_loop(I first, I last, Size depth_limit, C & pred, P & proj)
        {
            while(last - first > detail::introsort_threshold())
            {
                if(depth_limit == 0)
                    return partial_sort(
                               first, last, last, std::ref(pred), std::ref(proj)),
                           void();
                I cut = detail::unguarded_partition(first, last, pred, proj);
                detail::introsort_loop(cut, last, --depth_limit, pred, proj);
                last = cut;
            }
        }